

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whereami.c
# Opt level: O3

int wai_getExecutablePath(char *out,int capacity,int *dirname_length)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  char buffer [4096];
  char acStack_1028 [4096];
  
  pcVar2 = realpath("/proc/self/exe",acStack_1028);
  if (pcVar2 == (char *)0x0) {
    iVar5 = -1;
  }
  else {
    sVar3 = strlen(pcVar2);
    iVar5 = (int)sVar3;
    if ((iVar5 <= capacity) && (memcpy(out,pcVar2,(long)iVar5), dirname_length != (int *)0x0)) {
      pcVar2 = out + (sVar3 & 0xffffffff);
      uVar4 = sVar3 & 0xffffffff;
      do {
        pcVar2 = pcVar2 + -1;
        if ((int)uVar4 < 1) {
          return iVar5;
        }
        uVar1 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar1;
      } while (*pcVar2 != '/');
      *dirname_length = uVar1;
    }
  }
  return iVar5;
}

Assistant:

WAI_FUNCSPEC
int WAI_PREFIX(getExecutablePath)(char* out, int capacity, int* dirname_length)
{
  char buffer[PATH_MAX];
  char* resolved = NULL;
  int length = -1;
  bool ok;

  for (ok = false; !ok; ok = true)
  {
    resolved = realpath(WAI_PROC_SELF_EXE, buffer);
    if (!resolved)
      break;

    length = (int)strlen(resolved);
    if (length <= capacity)
    {
      memcpy(out, resolved, length);

      if (dirname_length)
      {
        int i;

        for (i = length - 1; i >= 0; --i)
        {
          if (out[i] == '/')
          {
            *dirname_length = i;
            break;
          }
        }
      }
    }
  }

  return ok ? length : -1;
}